

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonArrayFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  long lVar1;
  JsonParse *in_RDX;
  int in_ESI;
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  int i;
  JsonString jx;
  sqlite3_context *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 uVar2;
  int iVar3;
  undefined4 in_stack_ffffffffffffff60;
  undefined1 local_90 [8];
  sqlite3_value *in_stack_ffffffffffffff78;
  JsonString *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0xaaaaaaaa;
  memset(local_90,0xaa,0x88);
  jsonStringInit((JsonString *)CONCAT44(uVar2,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48);
  jsonAppendChar((JsonString *)CONCAT44(uVar2,in_stack_ffffffffffffff50),
                 (char)((ulong)in_stack_ffffffffffffff48 >> 0x38));
  for (iVar3 = 0; iVar3 < in_ESI; iVar3 = iVar3 + 1) {
    jsonAppendSeparator((JsonString *)CONCAT44(iVar3,in_stack_ffffffffffffff50));
    jsonAppendSqlValue(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  jsonAppendChar((JsonString *)CONCAT44(iVar3,in_stack_ffffffffffffff50),
                 (char)((ulong)local_90 >> 0x38));
  jsonReturnString((JsonString *)CONCAT44(in_ESI,in_stack_ffffffffffffff60),in_RDX,
                   (sqlite3_context *)CONCAT44(iVar3,in_stack_ffffffffffffff50));
  sqlite3_result_subtype(in_RDI,0x4a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonArrayFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  int i;
  JsonString jx;

  jsonStringInit(&jx, ctx);
  jsonAppendChar(&jx, '[');
  for(i=0; i<argc; i++){
    jsonAppendSeparator(&jx);
    jsonAppendSqlValue(&jx, argv[i]);
  }
  jsonAppendChar(&jx, ']');
  jsonReturnString(&jx, 0, 0);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}